

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_handler.cpp
# Opt level: O0

spv_result_t spvtools::anon_unknown_6::advance(spv_text text,spv_position position)

{
  spv_result_t sVar1;
  spv_result_t error;
  spv_position position_local;
  spv_text text_local;
  
  do {
    if (text->length <= position->index) {
      return SPV_END_OF_STREAM;
    }
    switch(text->str[position->index]) {
    case '\0':
      return SPV_END_OF_STREAM;
    default:
      return SPV_SUCCESS;
    case '\t':
    case '\r':
    case ' ':
      position->column = position->column + 1;
      position->index = position->index + 1;
      break;
    case '\n':
      position->column = 0;
      position->line = position->line + 1;
      position->index = position->index + 1;
      break;
    case ';':
      sVar1 = advanceLine(text,position);
      if (sVar1 != SPV_SUCCESS) {
        return sVar1;
      }
    }
  } while( true );
}

Assistant:

spv_result_t advance(spv_text text, spv_position position) {
  // NOTE: Consume white space, otherwise don't advance.
  while (true) {
    if (position->index >= text->length) return SPV_END_OF_STREAM;
    switch (text->str[position->index]) {
      case '\0':
        return SPV_END_OF_STREAM;
      case ';':
        if (spv_result_t error = advanceLine(text, position)) return error;
        continue;
      case ' ':
      case '\t':
      case '\r':
        position->column++;
        position->index++;
        continue;
      case '\n':
        position->column = 0;
        position->line++;
        position->index++;
        continue;
      default:
        return SPV_SUCCESS;
    }
  }
}